

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall front::irGenerator::irGenerator::ir_end_of_program(irGenerator *this)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI
  ;
  JumpKind in_stack_00000064;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000068;
  LabelId in_stack_00000074;
  LabelId in_stack_00000078;
  JumpInstructionKind in_stack_0000007c;
  irGenerator *in_stack_00000080;
  TyKind in_stack_00000094;
  undefined7 in_stack_00000098;
  bool in_stack_0000009f;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000000a0;
  string *in_stack_000000a8;
  SymbolKind in_stack_000000b4;
  string *in_stack_000000b8;
  irGenerator *in_stack_000000c0;
  string returnTmp;
  irGenerator *in_stack_00000150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__t;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [24];
  string *in_stack_ffffffffffffff80;
  irGenerator *in_stack_ffffffffffffff88;
  string local_48 [32];
  string local_28 [40];
  
  getNewTmpValueName_abi_cxx11_
            ((irGenerator *)CONCAT17(in_stack_0000009f,in_stack_00000098),in_stack_00000094);
  std::__cxx11::string::string(local_48,local_28);
  std::__cxx11::string::string
            (local_98,(string *)
                      ((long)&in_RDI[4].
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x18));
  getFunctionName(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_b8._M_dataplus = (_Alloc_hider)0x0;
  local_b8._1_7_ = 0;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity = 0;
  __t = &local_b8;
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x262524);
  ir_function_call(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000a8,
                   in_stack_000000a0,in_stack_0000009f);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(in_stack_ffffffffffffff20);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_48);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (in_RDI,__t);
  ir_jump(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074,in_stack_00000068,
          in_stack_00000064);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2625b6);
  ir_leave_function(in_stack_00000150);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void irGenerator::ir_end_of_program() {
  string returnTmp = getNewTmpValueName(mir::types::TyKind::Int);
  ir_function_call(returnTmp, front::symbol::SymbolKind::INT,
                   getFunctionName(_GlobalInitFuncName), {});
  ir_jump(mir::inst::JumpInstructionKind::Return, -1, -1, returnTmp,
          mir::inst::JumpKind::Undefined);
  ir_leave_function();
}